

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O0

__pid_t __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
::wait(proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
       *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  pointer paVar1;
  proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
  *this_local;
  
  paVar1 = std::
           unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t>_>
           ::operator->(&this->m_disp);
  (*(paVar1->super_dispatcher_t)._vptr_dispatcher_t[4])();
  std::
  unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t>_>
  ::reset(&this->m_disp,(pointer)0x0);
  return extraout_EAX;
}

Assistant:

virtual void
		wait() override
			{
				m_disp->wait();

				m_disp.reset();
			}